

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O2

istream * amrex::operator>>(istream *is,Geometry *g)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  istream *piVar4;
  Array<int,_3> *period;
  char c;
  IntVect is_per;
  Box bx;
  RealBox rb;
  char local_91;
  Array<int,_3> local_90;
  Array<int,_3> local_80;
  Box local_74;
  RealBox local_58;
  
  local_74.smallend.vect[0] = 1;
  local_74.smallend.vect[1] = 1;
  local_74.smallend.vect[2] = 1;
  local_74.bigend.vect[0] = 0;
  local_74.bigend.vect[1] = 0;
  local_74.bigend.vect[2] = 0;
  local_74.btype.itype = 0;
  local_58.xlo[0] = 0.0;
  local_58.xlo[1] = 0.0;
  local_58.xlo[2] = 0.0;
  local_58.xhi[0] = -1.0;
  local_58.xhi[1] = -1.0;
  local_58.xhi[2] = -1.0;
  piVar4 = operator>>(is,&g->super_CoordSys);
  piVar4 = operator>>(piVar4,&local_58);
  operator>>(piVar4,&local_74);
  Geometry::Domain(g,&local_74);
  Geometry::ProbDomain(g,&local_58);
  iVar2 = std::istream::peek();
  if (iVar2 == 0x50) {
    std::operator>>(is,&local_91);
    local_90._M_elems[0] = 0;
    local_90._M_elems[1] = 0;
    local_90._M_elems[2] = 0;
    operator>>(is,(IntVect *)&local_90);
    period = &local_80;
    local_80._M_elems[0] = local_90._M_elems[0];
    local_80._M_elems[1] = local_90._M_elems[1];
    uVar3 = local_90._M_elems[2];
  }
  else {
    lVar1 = **(long **)(DAT_006e0238 + -8);
    uVar3 = (uint)*(byte *)(lVar1 + 0x53);
    local_90._M_elems._0_8_ =
         (ulong)*(byte *)(lVar1 + 0x52) << 0x20 | (ulong)*(byte *)(lVar1 + 0x51);
    period = &local_90;
  }
  period->_M_elems[2] = uVar3;
  Geometry::setPeriodicity(g,period);
  return is;
}

Assistant:

std::istream&
operator>> (std::istream& is,
            Geometry&     g)
{
    Box     bx;
    RealBox rb;
    is >> (CoordSys&) g >> rb >> bx;
    g.Domain(bx);
    g.ProbDomain(rb);

    int ic = is.peek();
    if (ic == static_cast<int>('P')) {
        char c;
        is >> c;
        IntVect is_per;
        is >> is_per;
        g.setPeriodicity({{AMREX_D_DECL(is_per[0],is_per[1],is_per[2])}});
    } else {
        g.setPeriodicity(DefaultGeometry().isPeriodic());
    }

    return is;
}